

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O2

ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *buffer,ZyanString **string)

{
  void *pvVar1;
  uint __line;
  ZyanStatus ZVar2;
  char *__assertion;
  
  ZVar2 = 0x80100004;
  if (string != (ZyanString **)0x0 && buffer != (ZydisFormatterBuffer *)0x0) {
    pvVar1 = (buffer->string).vector.data;
    if (buffer->is_token_list == '\0') {
      if (pvVar1 == (void *)0x0) {
        __assertion = "buffer->string.vector.data";
        __line = 0x67;
        goto LAB_00120211;
      }
    }
    else if (*(char *)((long)pvVar1 + -2) == '\0') {
      return 0x80100005;
    }
    if ((buffer->string).vector.size == 0) {
      __assertion = "buffer->string.vector.size";
      __line = 0x68;
LAB_00120211:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBuffer.c"
                    ,__line,
                    "ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *, ZyanString **)"
                   );
    }
    *string = &buffer->string;
    ZVar2 = 0x100000;
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer* buffer, ZyanString** string)
{
    if (!buffer || !string)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (buffer->is_token_list &&
        ((ZydisFormatterTokenConst*)buffer->string.vector.data - 1)->type == ZYDIS_TOKEN_INVALID)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }

    ZYAN_ASSERT(buffer->string.vector.data);
    ZYAN_ASSERT(buffer->string.vector.size);

    *string = &buffer->string;

    return ZYAN_STATUS_SUCCESS;
}